

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int pkey_ctrl_gost(EVP_PKEY *pkey,int op,long arg1,void *arg2)

{
  int iVar1;
  ASN1_STRING *pval;
  EVP_PKEY_CTX *ctx;
  void *pvVar2;
  ASN1_OBJECT *pAVar3;
  long lVar4;
  PKCS7_SIGNER_INFO *in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  CMS_RecipientInfo *ri_1;
  EVP_PKEY_CTX *pctx_1;
  int ka_nid;
  ASN1_STRING *params_1;
  gost_pmeth_data *gctx;
  CMS_RecipientInfo *ri;
  EVP_PKEY_CTX *pctx;
  ASN1_STRING *params;
  X509_ALGOR *alg2;
  X509_ALGOR *alg1;
  int md_nid;
  int nid;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  EVP_PKEY_CTX *in_stack_ffffffffffffff48;
  X509_ALGOR *pXVar5;
  undefined8 in_stack_ffffffffffffff50;
  EVP_PKEY *in_stack_ffffffffffffff58;
  ASN1_STRING *local_68;
  X509_ALGOR *local_40;
  X509_ALGOR *local_38;
  int local_30;
  int local_2c;
  PKCS7_SIGNER_INFO *local_28;
  long local_20;
  undefined4 local_14;
  undefined8 local_10;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_2c = EVP_PKEY_get_base_id(in_RDI);
  local_38 = (X509_ALGOR *)0x0;
  local_40 = (X509_ALGOR *)0x0;
  if ((local_2c - 0x32bU < 2) || (local_2c == 0x331)) {
    local_30 = 0x329;
  }
  else if (local_2c == 0x3d3) {
    local_30 = 0x3d6;
  }
  else {
    if (local_2c != 0x3d4) {
      return -1;
    }
    local_30 = 0x3d7;
  }
  switch(local_14) {
  case 1:
    if (local_20 == 0) {
      PKCS7_SIGNER_INFO_get0_algs(local_28,(EVP_PKEY **)0x0,&local_38,&local_40);
      pXVar5 = local_38;
      pAVar3 = OBJ_nid2obj(local_30);
      X509_ALGOR_set0(pXVar5,pAVar3,5,(void *)0x0);
      pXVar5 = local_40;
      pAVar3 = OBJ_nid2obj(local_2c);
      X509_ALGOR_set0(pXVar5,pAVar3,5,(void *)0x0);
    }
    local_4 = 1;
    break;
  case 2:
    if (local_20 == 0) {
      pval = encode_gost_algor_params(in_stack_ffffffffffffff58);
      if (pval == (ASN1_STRING *)0x0) {
        return -1;
      }
      PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)local_28,&local_38);
      pXVar5 = local_38;
      iVar1 = EVP_PKEY_get_id(local_10);
      pAVar3 = OBJ_nid2obj(iVar1);
      X509_ALGOR_set0(pXVar5,pAVar3,0x10,pval);
    }
    local_4 = 1;
    break;
  case 3:
    *(int *)&local_28->version = local_30;
    local_4 = 2;
    break;
  default:
    local_4 = -2;
    break;
  case 5:
    if (local_20 == 0) {
      CMS_SignerInfo_get0_algs
                ((CMS_SignerInfo *)local_28,(EVP_PKEY **)0x0,(X509 **)0x0,&local_38,&local_40);
      pXVar5 = local_38;
      pAVar3 = OBJ_nid2obj(local_30);
      X509_ALGOR_set0(pXVar5,pAVar3,5,(void *)0x0);
      pXVar5 = local_40;
      pAVar3 = OBJ_nid2obj(local_2c);
      X509_ALGOR_set0(pXVar5,pAVar3,5,(void *)0x0);
    }
    local_4 = 1;
    break;
  case 7:
    if (local_20 == 0) {
      ctx = (EVP_PKEY_CTX *)CMS_RecipientInfo_get0_pkey_ctx(local_28);
      if (ctx == (EVP_PKEY_CTX *)0x0) {
        local_4 = 0;
      }
      else {
        pvVar2 = EVP_PKEY_CTX_get_data(ctx);
        if ((*(int *)((long)pvVar2 + 0x3c) == 0x3f5) || (*(int *)((long)pvVar2 + 0x3c) == 0x4a4)) {
          local_2c = 0x49f;
          if (*(int *)((long)pvVar2 + 0x3c) == 0x4a4) {
            local_2c = 0x49d;
          }
          EVP_PKEY_get_base_id(local_10);
          local_68 = gost_encode_cms_params(iVar1);
        }
        else {
          local_68 = encode_gost_algor_params(in_stack_ffffffffffffff58);
        }
        if (local_68 == (ASN1_STRING *)0x0) {
          local_4 = -1;
        }
        else {
          CMS_RecipientInfo_ktri_get0_algs
                    ((CMS_RecipientInfo *)local_28,(EVP_PKEY **)0x0,(X509 **)0x0,&local_38);
          pXVar5 = local_38;
          pAVar3 = OBJ_nid2obj(local_2c);
          X509_ALGOR_set0(pXVar5,pAVar3,0x10,local_68);
          local_4 = 1;
        }
      }
    }
    else {
      lVar4 = CMS_RecipientInfo_get0_pkey_ctx(local_28);
      if (lVar4 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = gost_cms_set_shared_info
                            (in_stack_ffffffffffffff48,
                             (CMS_RecipientInfo *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
    }
    break;
  case 8:
    *(undefined4 *)&local_28->version = 0;
    local_4 = 1;
    break;
  case 0xb:
    if ((local_20 == 1) || (local_20 == 0)) {
      *(undefined4 *)&local_28->version = 1;
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int pkey_ctrl_gost(EVP_PKEY *pkey, int op, long arg1, void *arg2)
{
    int nid = EVP_PKEY_base_id(pkey), md_nid = NID_undef;
    X509_ALGOR *alg1 = NULL, *alg2 = NULL;

    switch (nid) {
    case NID_id_GostR3410_2012_512:
        md_nid = NID_id_GostR3411_2012_512;
        break;
    case NID_id_GostR3410_2012_256:
        md_nid = NID_id_GostR3411_2012_256;
        break;
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_94:
        md_nid = NID_id_GostR3411_94;
        break;
    default:
        return -1;
    }

    switch (op) {
    case ASN1_PKEY_CTRL_PKCS7_SIGN:
        if (arg1 == 0) {
            PKCS7_SIGNER_INFO_get0_algs((PKCS7_SIGNER_INFO *)arg2, NULL,
                                        &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_SIGN:
        if (arg1 == 0) {
            CMS_SignerInfo_get0_algs((CMS_SignerInfo *)arg2, NULL, NULL,
                                     &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#endif
    case ASN1_PKEY_CTRL_PKCS7_ENCRYPT:
        if (arg1 == 0) { /* Encryption */
            ASN1_STRING *params = encode_gost_algor_params(pkey);
            if (!params) {
                return -1;
            }
            PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)arg2, &alg1);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(EVP_PKEY_id(pkey)),
                            V_ASN1_SEQUENCE, params);
				}
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_ENVELOPE:
        if (arg1 == 0) {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;

          struct gost_pmeth_data *gctx = NULL;
          ASN1_STRING *params = NULL;

          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
            return 0;

          gctx = EVP_PKEY_CTX_get_data(pctx);

          switch (gctx->cipher_nid) {
            case NID_magma_ctr:
            case NID_kuznyechik_ctr:
              {
                int ka_nid;

                nid = (gctx->cipher_nid == NID_magma_ctr) ? NID_magma_kexp15 :
                  NID_kuznyechik_kexp15;

                ka_nid = (EVP_PKEY_base_id(pkey) == NID_id_GostR3410_2012_256) ?
                  NID_id_tc26_agreement_gost_3410_2012_256 : NID_id_tc26_agreement_gost_3410_2012_512;

                params = gost_encode_cms_params(ka_nid);
              }
              break;
            default:
                params = encode_gost_algor_params(pkey);
              break;
          }

          if (params == NULL)
              return -1;

          CMS_RecipientInfo_ktri_get0_algs((CMS_RecipientInfo *)arg2, NULL,
              NULL, &alg1);
          X509_ALGOR_set0(alg1, OBJ_nid2obj(nid), V_ASN1_SEQUENCE, params);
        } else {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;
          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
              return 0;
          return gost_cms_set_shared_info(pctx, ri);
        }
        return 1;
#ifdef ASN1_PKEY_CTRL_CMS_RI_TYPE
  case ASN1_PKEY_CTRL_CMS_RI_TYPE:
        *(int *)arg2 = CMS_RECIPINFO_TRANS;
        return 1;
	case ASN1_PKEY_CTRL_CMS_IS_RI_TYPE_SUPPORTED:
			if (arg1 == CMS_RECIPINFO_AGREE || arg1 == CMS_RECIPINFO_TRANS) {
          *(int *)arg2 = 1;
				  return 1;
      }
			else
				  return 0;
			break;
#endif
#endif
    case ASN1_PKEY_CTRL_DEFAULT_MD_NID:
        *(int *)arg2 = md_nid;
        return 2;
    }

    return -2;
}